

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O0

Bit32u __thiscall MT32Emu::Partial::getCutoffValue(Partial *this)

{
  bool bVar1;
  byte bVar2;
  Bit32u BVar3;
  Bit32u cutoffModifierRampVal;
  Partial *this_local;
  
  bVar1 = isPCM(this);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    BVar3 = LA32Ramp::nextValue(&this->cutoffModifierRamp);
    bVar1 = LA32Ramp::checkInterrupt(&this->cutoffModifierRamp);
    if (bVar1) {
      TVF::handleInterrupt(this->tvf);
    }
    bVar2 = TVF::getBaseCutoff(this->tvf);
    this_local._4_4_ = (uint)bVar2 * 0x40000 + BVar3;
  }
  return this_local._4_4_;
}

Assistant:

Bit32u Partial::getCutoffValue() {
	if (isPCM()) {
		return 0;
	}
	Bit32u cutoffModifierRampVal = cutoffModifierRamp.nextValue();
	if (cutoffModifierRamp.checkInterrupt()) {
		tvf->handleInterrupt();
	}
	return (tvf->getBaseCutoff() << 18) + cutoffModifierRampVal;
}